

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O3

char * mpp_get_mpp_service_name(void)

{
  char *pcVar1;
  int iVar2;
  
  pcVar1 = mpp_get_mpp_service_name::mpp_service_name;
  if (mpp_get_mpp_service_name::mpp_service_name == (char *)0x0) {
    iVar2 = access("/dev/mpp_service",6);
    pcVar1 = "/dev/mpp_service";
    if (iVar2 != 0) {
      iVar2 = access("/dev/mpp-service",6);
      pcVar1 = "/dev/mpp-service";
      if (iVar2 != 0) {
        pcVar1 = mpp_get_mpp_service_name::mpp_service_name;
      }
    }
  }
  mpp_get_mpp_service_name::mpp_service_name = pcVar1;
  return mpp_get_mpp_service_name::mpp_service_name;
}

Assistant:

const char *mpp_get_mpp_service_name(void)
{
    static const char *mpp_service_name = NULL;
    static const char *mpp_service_dev[] = {
        "/dev/mpp_service",
        "/dev/mpp-service",
    };

    if (mpp_service_name)
        return mpp_service_name;

    if (!access(mpp_service_dev[0], F_OK | R_OK | W_OK)) {
        mpp_service_name = mpp_service_dev[0];
    } else if (!access(mpp_service_dev[1], F_OK | R_OK | W_OK))
        mpp_service_name = mpp_service_dev[1];

    return mpp_service_name;
}